

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  _Alloc_hider _Var4;
  long *__s;
  pointer pbVar5;
  mode_t *pmVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  size_t sVar11;
  char *pcVar12;
  ostream *poVar13;
  bool bVar14;
  uint uVar15;
  long *__s_00;
  pointer arg;
  mode_t default_dir_mode_v;
  string bareTempInstallDirectory;
  string tempInstallDirectoryStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  ostringstream cmCPackLog_msg;
  mode_t local_22c;
  string local_228;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  mode_t *local_38;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Install projects",0x10);
  std::ios::widen((char)(ostringstream *)local_1b0 + (char)*(undefined8 *)(local_1b0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1b0);
  std::ostream::flush();
  pcVar3 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_208._M_dataplus._M_p;
  sVar11 = strlen(local_208._M_dataplus._M_p);
  cmCPackLog::Log(pcVar3,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xaf,_Var4._M_p,sVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  CleanTemporaryDirectory(this);
  pcVar2 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
  pcVar12 = GetOption(this,(string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar12,(allocator<char> *)local_1e8);
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  local_1b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"CPACK_SET_DESTDIR","");
  pcVar12 = GetOption(this,(string *)local_1b0);
  bVar7 = cmSystemTools::IsOn(pcVar12);
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CPACK_SET_DESTDIR","");
  pcVar12 = GetOption(this,&local_228);
  bVar8 = cmSystemTools::IsInternallyOn(pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  bVar14 = bVar7 || bVar8;
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (!bVar7 && !bVar8) {
    (*this->_vptr_cmCPackGenerator[0xb])(this);
    std::__cxx11::string::append((char *)local_1e8);
  }
  __s = local_1e8[0];
  bVar9 = cmsys::SystemTools::MakeDirectory(&local_208,(mode_t *)0x0);
  if (bVar9) {
    if (bVar7 || bVar8) {
      local_1b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DESTDIR=","");
      std::__cxx11::string::append(local_1b0);
      cmsys::SystemTools::PutEnv((string *)local_1b0);
    }
    else {
      local_1b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DESTDIR=","");
      cmsys::SystemTools::PutEnv((string *)local_1b0);
    }
    if ((pointer)local_1b0._0_8_ != pcVar2) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    local_22c = 0;
    local_1b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
    pcVar12 = GetOption(this,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar2) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
      local_38 = (mode_t *)0x0;
    }
    else {
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b0._0_8_ = pcVar2;
      sVar11 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,pcVar12,pcVar12 + sVar11);
      cmSystemTools::ExpandListArgument((string *)local_1b0,&local_1c8,false);
      if ((pointer)local_1b0._0_8_ != pcVar2) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      pbVar5 = local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        arg = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar9 = cmFSPermissions::stringToModeT(arg,&local_22c);
          if (!bVar9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"Invalid permission value \'",0x1a);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,(arg->_M_dataplus)._M_p,arg->_M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"\'. CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS value is invalid.",
                       0x40);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar3 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var4._M_p = local_228._M_dataplus._M_p;
            sVar11 = strlen(local_228._M_dataplus._M_p);
            cmCPackLog::Log(pcVar3,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xde,_Var4._M_p,sVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            std::ios_base::~ios_base(local_140);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1c8);
            goto LAB_00146daa;
          }
          arg = arg + 1;
        } while (arg != pbVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      local_38 = &local_22c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,(char *)__s,(allocator<char> *)&local_228);
    iVar10 = (*this->_vptr_cmCPackGenerator[0x10])(this,(ulong)bVar14,local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    uVar15 = 0;
    if (iVar10 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,(char *)__s,(allocator<char> *)&local_228);
      iVar10 = (*this->_vptr_cmCPackGenerator[0x11])(this,(ulong)bVar14,local_1b0);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if (iVar10 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,(char *)__s,(allocator<char> *)&local_228);
        pmVar6 = local_38;
        iVar10 = (*this->_vptr_cmCPackGenerator[0x12])(this,(ulong)bVar14,local_1b0,local_38);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar10 != 0) {
          iVar10 = (*this->_vptr_cmCPackGenerator[0x13])(this,(ulong)bVar14,&local_208,pmVar6);
          if ((bVar7 || bVar8) && iVar10 != 0) {
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DESTDIR=","");
            cmsys::SystemTools::PutEnv((string *)local_1b0);
            if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
            uVar15 = 1;
          }
          else {
            uVar15 = (uint)(iVar10 != 0);
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"Problem creating temporary directory: ",0x26);
    __s_00 = (long *)"(NULL)";
    if (__s != (long *)0x0) {
      __s_00 = __s;
    }
    sVar11 = strlen((char *)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,(char *)__s_00,sVar11);
    std::ios::widen((char)(ostream *)local_1b0 + (char)*(undefined8 *)(local_1b0._0_8_ + -0x18));
    std::ostream::put((char)local_1b0);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_228._M_dataplus._M_p;
    sVar11 = strlen(local_228._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xc1,_Var4._M_p,sVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
LAB_00146daa:
    uVar15 = 0;
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return uVar15;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR")) |
    cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir) {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
  }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if (!cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem creating temporary directory: "
                    << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                    << std::endl);
    return 0;
  }

  if (setDestDir) {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
  } else {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
  }

  // prepare default created directory permissions
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = nullptr;
  const char* default_dir_install_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!cmFSPermissions::stringToModeT(arg, default_dir_mode_v)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Invalid permission value '"
                        << arg
                        << "'."
                           " CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
                           "value is invalid."
                        << std::endl);
        return 0;
      }
    }

    default_dir_mode = &default_dir_mode_v;
  }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if (!this->InstallProjectViaInstallCommands(setDestDir,
                                              tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if (!this->InstallProjectViaInstallScript(setDestDir,
                                            tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if (!this->InstallProjectViaInstalledDirectories(
        setDestDir, tempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if (!this->InstallProjectViaInstallCMakeProjects(
        setDestDir, bareTempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  if (setDestDir) {
    cmSystemTools::PutEnv("DESTDIR=");
  }

  return res;
}